

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::XFormWidget::XFormWidget(XFormWidget *this)

{
  _Rb_tree_header *p_Var1;
  
  SceneObject::SceneObject(&this->super_SceneObject);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_00280818;
  (this->target).object = (SceneObject *)0x0;
  (this->target).element = (HalfedgeElement *)0x0;
  (this->target).coordinates.x = 0.0;
  (this->target).coordinates.y = 0.0;
  (this->target).coordinates.z = 0.0;
  (this->target).axis = None;
  p_Var1 = &(this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header;
  (this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BBox::BBox(&this->bounds);
  this->mode = Translate;
  this->lastMode = Translate;
  (this->target).object = (SceneObject *)0x0;
  (this->target).element = (HalfedgeElement *)0x0;
  *(undefined8 *)((long)&(this->center).y + 4) = 0;
  *(undefined8 *)((long)&(this->center).z + 4) = 0;
  (this->center).x = 0.0;
  (this->center).y = 0.0;
  (this->clickPosition).x = 0.0;
  (this->clickPosition).y = 0.0;
  (this->axisColors).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->axisColors).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->axisColors).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

XFormWidget::XFormWidget() {
  target.object = nullptr;
  target.element = nullptr;
  objectMode = false;
  transformedMode = false;
  poseMode = false;
  mode = lastMode = Mode::Translate;
}